

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ExtensionRangeFeaturesDefault_Test::TestBody
          (FeaturesTest_ExtensionRangeFeaturesDefault_Test *this)

{
  ExtensionRange *descriptor;
  FileDescriptor *pFVar1;
  undefined8 extraout_RAX;
  char *pcVar2;
  string_view file_text;
  Metadata MVar3;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_68 [8];
  InternalMetadata local_60;
  
  MVar3 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar3.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    message_type {\n      name: \"Foo\"\n      extension_range { start: 1 end: 100 }\n    }\n  "
  ;
  file_text._M_len = 0xa1;
  pFVar1 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  if (pFVar1->message_type_count_ < 1) {
    TestBody();
  }
  else if (0 < pFVar1->message_types_->extension_range_count_) {
    descriptor = pFVar1->message_types_->extension_ranges_;
    pcVar2 = anon_var_dwarf_a22956 + 5;
    local_78._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (anon_var_dwarf_a22956 + 5);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_68,(char *)&local_78,(ExtensionRangeOptions *)"range->options()");
    if (local_68[0] == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = *(char **)local_60.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x286b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_60.ptr_);
    }
    local_80.data_ = (AssertHelperData *)0x109c4c2;
    GetCoreFeatures<google::protobuf::Descriptor::ExtensionRange>((FeatureSet *)local_68,descriptor)
    ;
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (&local_78,(char *)&local_80,(FeatureSet *)"GetCoreFeatures(range)");
    FeatureSet::~FeatureSet((FeatureSet *)local_68);
    if ((char)local_78._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_68);
      if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar2 = (local_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x2879,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)CONCAT71(local_68._1_7_,local_68[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_68._1_7_,local_68[0]) + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    return;
  }
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((long *)CONCAT71(local_68._1_7_,local_68[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_68._1_7_,local_68[0]) + 8))();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, ExtensionRangeFeaturesDefault) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    message_type {
      name: "Foo"
      extension_range { start: 1 end: 100 }
    }
  )pb");
  const Descriptor::ExtensionRange* range =
      file->message_type(0)->extension_range(0);
  EXPECT_THAT(range->options(), EqualsProto(""));
  EXPECT_THAT(GetCoreFeatures(range), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: OPEN
                repeated_field_encoding: PACKED
                utf8_validation: VERIFY
                message_encoding: LENGTH_PREFIXED
                json_format: ALLOW
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: false
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
}